

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlInitSAXParserCtxt(xmlParserCtxtPtr ctxt,xmlSAXHandler *sax,void *userData)

{
  xmlDictPtr pxVar1;
  _xmlSAXHandler *p_Var2;
  xmlParserInputPtr *ppxVar3;
  xmlParserInputPtr input_00;
  xmlNodePtr *ppxVar4;
  xmlChar **ppxVar5;
  int *piVar6;
  xmlParserCtxtPtr local_38;
  xmlParserInputPtr input;
  void *userData_local;
  xmlSAXHandler *sax_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    xmlErrInternal((xmlParserCtxtPtr)0x0,"Got NULL parser context\n",(xmlChar *)0x0);
    ctxt_local._4_4_ = -1;
  }
  else {
    xmlInitParser();
    if (ctxt->dict == (xmlDictPtr)0x0) {
      pxVar1 = xmlDictCreate();
      ctxt->dict = pxVar1;
    }
    if (ctxt->dict == (xmlDictPtr)0x0) {
      xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
      ctxt_local._4_4_ = -1;
    }
    else {
      xmlDictSetLimit(ctxt->dict,10000000);
      if (ctxt->sax == (_xmlSAXHandler *)0x0) {
        p_Var2 = (_xmlSAXHandler *)(*xmlMalloc)(0x100);
        ctxt->sax = p_Var2;
      }
      if (ctxt->sax == (_xmlSAXHandler *)0x0) {
        xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
        ctxt_local._4_4_ = -1;
      }
      else {
        if (sax == (xmlSAXHandler *)0x0) {
          memset(ctxt->sax,0,0x100);
          xmlSAXVersion(ctxt->sax,2);
          ctxt->userData = ctxt;
        }
        else {
          if (sax->initialized == 0xdeedbeaf) {
            memcpy(ctxt->sax,sax,0x100);
          }
          else {
            memset(ctxt->sax,0,0x100);
            memcpy(ctxt->sax,sax,0xe0);
          }
          local_38 = ctxt;
          if (userData != (void *)0x0) {
            local_38 = (xmlParserCtxtPtr)userData;
          }
          ctxt->userData = local_38;
        }
        ctxt->maxatts = 0;
        ctxt->atts = (xmlChar **)0x0;
        if (ctxt->inputTab == (xmlParserInputPtr *)0x0) {
          ppxVar3 = (xmlParserInputPtr *)(*xmlMalloc)(0x28);
          ctxt->inputTab = ppxVar3;
          ctxt->inputMax = 5;
        }
        if (ctxt->inputTab == (xmlParserInputPtr *)0x0) {
          xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
          ctxt->inputNr = 0;
          ctxt->inputMax = 0;
          ctxt->input = (xmlParserInputPtr)0x0;
          ctxt_local._4_4_ = -1;
        }
        else {
          while (input_00 = inputPop(ctxt), input_00 != (xmlParserInputPtr)0x0) {
            xmlFreeInputStream(input_00);
          }
          ctxt->inputNr = 0;
          ctxt->input = (xmlParserInputPtr)0x0;
          ctxt->version = (xmlChar *)0x0;
          ctxt->encoding = (xmlChar *)0x0;
          ctxt->standalone = -1;
          ctxt->hasExternalSubset = 0;
          ctxt->hasPErefs = 0;
          ctxt->html = 0;
          ctxt->external = 0;
          ctxt->instate = XML_PARSER_START;
          ctxt->token = 0;
          ctxt->directory = (char *)0x0;
          if (ctxt->nodeTab == (xmlNodePtr *)0x0) {
            ppxVar4 = (xmlNodePtr *)(*xmlMalloc)(0x50);
            ctxt->nodeTab = ppxVar4;
            ctxt->nodeMax = 10;
          }
          if (ctxt->nodeTab == (xmlNodePtr *)0x0) {
            xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
            ctxt->nodeNr = 0;
            ctxt->nodeMax = 0;
            ctxt->node = (xmlNodePtr)0x0;
            ctxt->inputNr = 0;
            ctxt->inputMax = 0;
            ctxt->input = (xmlParserInputPtr)0x0;
            ctxt_local._4_4_ = -1;
          }
          else {
            ctxt->nodeNr = 0;
            ctxt->node = (xmlNodePtr)0x0;
            if (ctxt->nameTab == (xmlChar **)0x0) {
              ppxVar5 = (xmlChar **)(*xmlMalloc)(0x50);
              ctxt->nameTab = ppxVar5;
              ctxt->nameMax = 10;
            }
            if (ctxt->nameTab == (xmlChar **)0x0) {
              xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
              ctxt->nodeNr = 0;
              ctxt->nodeMax = 0;
              ctxt->node = (xmlNodePtr)0x0;
              ctxt->inputNr = 0;
              ctxt->inputMax = 0;
              ctxt->input = (xmlParserInputPtr)0x0;
              ctxt->nameNr = 0;
              ctxt->nameMax = 0;
              ctxt->name = (xmlChar *)0x0;
              ctxt_local._4_4_ = -1;
            }
            else {
              ctxt->nameNr = 0;
              ctxt->name = (xmlChar *)0x0;
              if (ctxt->spaceTab == (int *)0x0) {
                piVar6 = (int *)(*xmlMalloc)(0x28);
                ctxt->spaceTab = piVar6;
                ctxt->spaceMax = 10;
              }
              if (ctxt->spaceTab == (int *)0x0) {
                xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
                ctxt->nodeNr = 0;
                ctxt->nodeMax = 0;
                ctxt->node = (xmlNodePtr)0x0;
                ctxt->inputNr = 0;
                ctxt->inputMax = 0;
                ctxt->input = (xmlParserInputPtr)0x0;
                ctxt->nameNr = 0;
                ctxt->nameMax = 0;
                ctxt->name = (xmlChar *)0x0;
                ctxt->spaceNr = 0;
                ctxt->spaceMax = 0;
                ctxt->space = (int *)0x0;
                ctxt_local._4_4_ = -1;
              }
              else {
                ctxt->spaceNr = 1;
                ctxt->spaceMax = 10;
                *ctxt->spaceTab = -1;
                ctxt->space = ctxt->spaceTab;
                ctxt->myDoc = (xmlDocPtr)0x0;
                ctxt->wellFormed = 1;
                ctxt->nsWellFormed = 1;
                ctxt->valid = 1;
                piVar6 = __xmlLoadExtDtdDefaultValue();
                ctxt->loadsubset = *piVar6;
                if (ctxt->loadsubset != 0) {
                  ctxt->options = ctxt->options | 4;
                }
                piVar6 = __xmlDoValidityCheckingDefaultValue();
                ctxt->validate = *piVar6;
                piVar6 = __xmlPedanticParserDefaultValue();
                ctxt->pedantic = *piVar6;
                if (ctxt->pedantic != 0) {
                  ctxt->options = ctxt->options | 0x80;
                }
                piVar6 = __xmlLineNumbersDefaultValue();
                ctxt->linenumbers = *piVar6;
                piVar6 = __xmlKeepBlanksDefaultValue();
                ctxt->keepBlanks = *piVar6;
                if (ctxt->keepBlanks == 0) {
                  ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
                  ctxt->options = ctxt->options | 0x100;
                }
                (ctxt->vctxt).flags = 2;
                (ctxt->vctxt).userData = ctxt;
                (ctxt->vctxt).error = xmlParserValidityError;
                (ctxt->vctxt).warning = xmlParserValidityWarning;
                if (ctxt->validate != 0) {
                  piVar6 = __xmlGetWarningsDefaultValue();
                  if (*piVar6 == 0) {
                    (ctxt->vctxt).warning = (xmlValidityWarningFunc)0x0;
                  }
                  else {
                    (ctxt->vctxt).warning = xmlParserValidityWarning;
                  }
                  (ctxt->vctxt).nodeMax = 0;
                  ctxt->options = ctxt->options | 0x10;
                }
                piVar6 = __xmlSubstituteEntitiesDefaultValue();
                ctxt->replaceEntities = *piVar6;
                if (ctxt->replaceEntities != 0) {
                  ctxt->options = ctxt->options | 2;
                }
                ctxt->record_info = 0;
                ctxt->checkIndex = 0;
                ctxt->inSubset = 0;
                ctxt->errNo = 0;
                ctxt->depth = 0;
                ctxt->charset = 1;
                ctxt->catalogs = (void *)0x0;
                ctxt->nbentities = 0;
                ctxt->sizeentities = 0;
                ctxt->sizeentcopy = 0;
                ctxt->input_id = 1;
                xmlInitNodeInfoSeq(&ctxt->node_seq);
                ctxt_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlInitSAXParserCtxt(xmlParserCtxtPtr ctxt, const xmlSAXHandler *sax,
                     void *userData)
{
    xmlParserInputPtr input;

    if(ctxt==NULL) {
        xmlErrInternal(NULL, "Got NULL parser context\n", NULL);
        return(-1);
    }

    xmlInitParser();

    if (ctxt->dict == NULL)
	ctxt->dict = xmlDictCreate();
    if (ctxt->dict == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	return(-1);
    }
    xmlDictSetLimit(ctxt->dict, XML_MAX_DICTIONARY_LIMIT);

    if (ctxt->sax == NULL)
	ctxt->sax = (xmlSAXHandler *) xmlMalloc(sizeof(xmlSAXHandler));
    if (ctxt->sax == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	return(-1);
    }
    if (sax == NULL) {
	memset(ctxt->sax, 0, sizeof(xmlSAXHandler));
        xmlSAXVersion(ctxt->sax, 2);
        ctxt->userData = ctxt;
    } else {
	if (sax->initialized == XML_SAX2_MAGIC) {
	    memcpy(ctxt->sax, sax, sizeof(xmlSAXHandler));
        } else {
	    memset(ctxt->sax, 0, sizeof(xmlSAXHandler));
	    memcpy(ctxt->sax, sax, sizeof(xmlSAXHandlerV1));
        }
        ctxt->userData = userData ? userData : ctxt;
    }

    ctxt->maxatts = 0;
    ctxt->atts = NULL;
    /* Allocate the Input stack */
    if (ctxt->inputTab == NULL) {
	ctxt->inputTab = (xmlParserInputPtr *)
		    xmlMalloc(5 * sizeof(xmlParserInputPtr));
	ctxt->inputMax = 5;
    }
    if (ctxt->inputTab == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	return(-1);
    }
    while ((input = inputPop(ctxt)) != NULL) { /* Non consuming */
        xmlFreeInputStream(input);
    }
    ctxt->inputNr = 0;
    ctxt->input = NULL;

    ctxt->version = NULL;
    ctxt->encoding = NULL;
    ctxt->standalone = -1;
    ctxt->hasExternalSubset = 0;
    ctxt->hasPErefs = 0;
    ctxt->html = 0;
    ctxt->external = 0;
    ctxt->instate = XML_PARSER_START;
    ctxt->token = 0;
    ctxt->directory = NULL;

    /* Allocate the Node stack */
    if (ctxt->nodeTab == NULL) {
	ctxt->nodeTab = (xmlNodePtr *) xmlMalloc(10 * sizeof(xmlNodePtr));
	ctxt->nodeMax = 10;
    }
    if (ctxt->nodeTab == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	ctxt->nodeNr = 0;
	ctxt->nodeMax = 0;
	ctxt->node = NULL;
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	return(-1);
    }
    ctxt->nodeNr = 0;
    ctxt->node = NULL;

    /* Allocate the Name stack */
    if (ctxt->nameTab == NULL) {
	ctxt->nameTab = (const xmlChar **) xmlMalloc(10 * sizeof(xmlChar *));
	ctxt->nameMax = 10;
    }
    if (ctxt->nameTab == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	ctxt->nodeNr = 0;
	ctxt->nodeMax = 0;
	ctxt->node = NULL;
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	ctxt->nameNr = 0;
	ctxt->nameMax = 0;
	ctxt->name = NULL;
	return(-1);
    }
    ctxt->nameNr = 0;
    ctxt->name = NULL;

    /* Allocate the space stack */
    if (ctxt->spaceTab == NULL) {
	ctxt->spaceTab = (int *) xmlMalloc(10 * sizeof(int));
	ctxt->spaceMax = 10;
    }
    if (ctxt->spaceTab == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	ctxt->nodeNr = 0;
	ctxt->nodeMax = 0;
	ctxt->node = NULL;
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	ctxt->nameNr = 0;
	ctxt->nameMax = 0;
	ctxt->name = NULL;
	ctxt->spaceNr = 0;
	ctxt->spaceMax = 0;
	ctxt->space = NULL;
	return(-1);
    }
    ctxt->spaceNr = 1;
    ctxt->spaceMax = 10;
    ctxt->spaceTab[0] = -1;
    ctxt->space = &ctxt->spaceTab[0];
    ctxt->myDoc = NULL;
    ctxt->wellFormed = 1;
    ctxt->nsWellFormed = 1;
    ctxt->valid = 1;
    ctxt->loadsubset = xmlLoadExtDtdDefaultValue;
    if (ctxt->loadsubset) {
        ctxt->options |= XML_PARSE_DTDLOAD;
    }
    ctxt->validate = xmlDoValidityCheckingDefaultValue;
    ctxt->pedantic = xmlPedanticParserDefaultValue;
    if (ctxt->pedantic) {
        ctxt->options |= XML_PARSE_PEDANTIC;
    }
    ctxt->linenumbers = xmlLineNumbersDefaultValue;
    ctxt->keepBlanks = xmlKeepBlanksDefaultValue;
    if (ctxt->keepBlanks == 0) {
	ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
	ctxt->options |= XML_PARSE_NOBLANKS;
    }

    ctxt->vctxt.flags = XML_VCTXT_USE_PCTXT;
    ctxt->vctxt.userData = ctxt;
    ctxt->vctxt.error = xmlParserValidityError;
    ctxt->vctxt.warning = xmlParserValidityWarning;
    if (ctxt->validate) {
	if (xmlGetWarningsDefaultValue == 0)
	    ctxt->vctxt.warning = NULL;
	else
	    ctxt->vctxt.warning = xmlParserValidityWarning;
	ctxt->vctxt.nodeMax = 0;
        ctxt->options |= XML_PARSE_DTDVALID;
    }
    ctxt->replaceEntities = xmlSubstituteEntitiesDefaultValue;
    if (ctxt->replaceEntities) {
        ctxt->options |= XML_PARSE_NOENT;
    }
    ctxt->record_info = 0;
    ctxt->checkIndex = 0;
    ctxt->inSubset = 0;
    ctxt->errNo = XML_ERR_OK;
    ctxt->depth = 0;
    ctxt->charset = XML_CHAR_ENCODING_UTF8;
    ctxt->catalogs = NULL;
    ctxt->nbentities = 0;
    ctxt->sizeentities = 0;
    ctxt->sizeentcopy = 0;
    ctxt->input_id = 1;
    xmlInitNodeInfoSeq(&ctxt->node_seq);
    return(0);
}